

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_proxy_module.c
# Opt level: O2

ngx_int_t ngx_http_proxy_create_request(ngx_http_request_t *r)

{
  ngx_http_upstream_t *pnVar1;
  void *pvVar2;
  void *pvVar3;
  ngx_log_t *pnVar4;
  bool bVar5;
  ngx_int_t nVar6;
  long lVar7;
  uintptr_t uVar8;
  long lVar9;
  void *pvVar10;
  ngx_buf_t *pnVar11;
  ngx_http_request_t *pnVar12;
  u_char *puVar13;
  long lVar14;
  void *pvVar15;
  ngx_http_request_t *pnVar16;
  byte bVar17;
  code *pcVar18;
  undefined8 *puVar19;
  size_t sVar20;
  code *pcVar21;
  long lVar22;
  ulong uVar23;
  ngx_str_t *pnVar24;
  u_char *puVar25;
  ngx_buf_t *pnVar26;
  ngx_buf_t *pnVar27;
  size_t sVar28;
  ngx_list_part_t *pnVar29;
  ngx_chain_t *pnVar30;
  byte bVar31;
  undefined8 *local_150;
  u_char *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  ulong local_110;
  undefined8 uStack_108;
  ngx_http_request_t *local_100;
  long *plStack_f8;
  ngx_http_script_engine_t le;
  undefined1 auStack_78 [8];
  ngx_str_t method;
  
  bVar31 = 0;
  pnVar1 = r->upstream;
  pvVar2 = r->loc_conf[ngx_http_proxy_module.ctx_index];
  puVar19 = (undefined8 *)((long)pvVar2 + 0x208);
  if ((pnVar1->field_0x3e8 & 2) == 0) {
    puVar19 = (undefined8 *)((long)pvVar2 + 0x1e0);
  }
  if ((pnVar1->method).len == 0) {
    if (*(ngx_http_complex_value_t **)((long)pvVar2 + 0x260) == (ngx_http_complex_value_t *)0x0) {
      auStack_78._0_4_ = (undefined4)(r->method_name).len;
      auStack_78._4_4_ = *(undefined4 *)((long)&(r->method_name).len + 4);
      method.len._0_4_ = *(undefined4 *)&(r->method_name).data;
      method.len._4_4_ = *(undefined4 *)((long)&(r->method_name).data + 4);
    }
    else {
      nVar6 = ngx_http_complex_value
                        (r,*(ngx_http_complex_value_t **)((long)pvVar2 + 0x260),
                         (ngx_str_t *)auStack_78);
      if (nVar6 != 0) {
        return -1;
      }
    }
  }
  else {
    auStack_78._0_4_ = (undefined4)(pnVar1->method).len;
    auStack_78._4_4_ = *(undefined4 *)((long)&(pnVar1->method).len + 4);
    method.len._0_4_ = *(undefined4 *)&(pnVar1->method).data;
    method.len._4_4_ = *(undefined4 *)((long)&(pnVar1->method).data + 4);
  }
  pvVar3 = r->ctx[ngx_http_proxy_module.ctx_index];
  if ((CONCAT44(auStack_78._4_4_,auStack_78._0_4_) == 4) &&
     (nVar6 = ngx_strncasecmp((u_char *)CONCAT44(method.len._4_4_,(undefined4)method.len),
                              (u_char *)"HEAD",4), nVar6 == 0)) {
    *(byte *)((long)pvVar3 + 0xa8) = *(byte *)((long)pvVar3 + 0xa8) | 1;
  }
  lVar22 = CONCAT44(auStack_78._4_4_,auStack_78._0_4_);
  sVar28 = *(size_t *)((long)pvVar3 + 0x80);
  if (*(long *)((long)pvVar2 + 0x238) == 0) {
    if (sVar28 == 0) goto LAB_00169ddc;
    uVar23 = *(ulong *)&r->field_0x460;
    if ((uVar23 >> 0x2b & 1) == 0) goto LAB_00169dfd;
    lVar14 = *(long *)((long)pvVar2 + 0x268);
LAB_00169e00:
    if (((uVar23 & 0x14000000000) == 0) && ((r->field_0x469 & 0x40) == 0)) {
      lVar7 = 0;
    }
    else {
      uVar8 = ngx_escape_uri((u_char *)0x0,(r->uri).data + lVar14,(r->uri).len - lVar14,0);
      lVar7 = uVar8 * 2;
      sVar28 = *(size_t *)((long)pvVar3 + 0x80);
    }
    sVar28 = (r->args).len + (lVar7 - lVar14) + sVar28 + (r->uri).len + 1;
    bVar5 = true;
LAB_00169e6f:
    if (sVar28 == 0) {
      pnVar4 = r->connection->log;
      if (pnVar4->log_level < 4) {
        return -1;
      }
      ngx_log_error_core(4,pnVar4,0,"zero length URI to proxy");
      return -1;
    }
  }
  else {
    if (sVar28 == 0) {
LAB_00169ddc:
      uVar23 = *(ulong *)&r->field_0x460;
      if (((uVar23 >> 0x2c & 1) == 0) || (r->main != r)) {
        sVar28 = 0;
LAB_00169dfd:
        lVar14 = 0;
        goto LAB_00169e00;
      }
      sVar28 = (r->unparsed_uri).len;
      lVar7 = 0;
      bVar5 = false;
      lVar14 = 0;
      goto LAB_00169e6f;
    }
    bVar5 = true;
    lVar14 = 0;
    lVar7 = 0;
  }
  sVar28 = lVar22 + 0xe + sVar28;
  le.args = (u_char *)0x0;
  le._64_8_ = 0;
  le.line.len = 0;
  le.line.data = (u_char *)0x0;
  le.buf.len = 0;
  le.buf.data = (u_char *)0x0;
  le.pos = (u_char *)0x0;
  le.sp = (ngx_http_variable_value_t *)0x0;
  plStack_f8 = (long *)0x0;
  le.ip = (u_char *)0x0;
  le.status = 0;
  ngx_http_script_flush_no_cacheable_variables(r,*(ngx_array_t **)((long)pvVar2 + 0x1b8));
  ngx_http_script_flush_no_cacheable_variables(r,(ngx_array_t *)*puVar19);
  if (*(undefined8 **)((long)pvVar2 + 0x1c0) == (undefined8 *)0x0) {
    if ((((r->headers_in).field_0x168 & 4) == 0) || ((r->field_0x469 & 0x20) == 0)) {
      *(off_t *)((long)pvVar3 + 0x90) = (r->headers_in).content_length_n;
    }
    else {
      *(undefined8 *)((long)pvVar3 + 0x90) = 0xffffffffffffffff;
      *(byte *)((long)pvVar3 + 0xa8) = *(byte *)((long)pvVar3 + 0xa8) | 2;
    }
  }
  else {
    plStack_f8 = (long *)**(undefined8 **)((long)pvVar2 + 0x1c0);
    le.args = (u_char *)((ulong)le.args | 1);
    lVar22 = 0;
    le.status = (ngx_int_t)r;
    while ((code *)*plStack_f8 != (code *)0x0) {
      lVar9 = (*(code *)*plStack_f8)(&plStack_f8);
      lVar22 = lVar22 + lVar9;
    }
    *(long *)((long)pvVar3 + 0x90) = lVar22;
    sVar28 = sVar28 + lVar22;
  }
  plStack_f8 = *(long **)puVar19[1];
  le.args = (u_char *)((ulong)le.args | 1);
  le.status = (ngx_int_t)r;
  for (; pcVar18 = (code *)*plStack_f8, pcVar18 != (code *)0x0; plStack_f8 = plStack_f8 + 1) {
    while (pcVar18 != (code *)0x0) {
      lVar22 = (*pcVar18)(&plStack_f8);
      sVar28 = sVar28 + lVar22;
      pcVar18 = (code *)*plStack_f8;
    }
  }
  if (*(long *)((long)pvVar2 + 0xb0) != 0) {
    pnVar29 = &(r->headers_in).headers.part;
    pvVar15 = (r->headers_in).headers.part.elts;
    uVar23 = 0;
    do {
      if (pnVar29->nelts <= uVar23) {
        pnVar29 = pnVar29->next;
        if (pnVar29 == (ngx_list_part_t *)0x0) break;
        pvVar15 = pnVar29->elts;
        uVar23 = 0;
      }
      lVar22 = uVar23 * 0x30;
      pvVar10 = ngx_hash_find((ngx_hash_t *)(puVar19 + 3),*(ngx_uint_t *)((long)pvVar15 + lVar22),
                              *(u_char **)((long)pvVar15 + lVar22 + 0x28),
                              *(size_t *)((long)pvVar15 + lVar22 + 8));
      if (pvVar10 == (void *)0x0) {
        sVar28 = sVar28 + *(long *)((long)pvVar15 + lVar22 + 8) +
                 *(long *)((long)pvVar15 + lVar22 + 0x18) + 4;
      }
      uVar23 = uVar23 + 1;
    } while( true );
  }
  pnVar11 = ngx_create_temp_buf(r->pool,sVar28);
  if ((pnVar11 == (ngx_buf_t *)0x0) ||
     (pnVar12 = (ngx_http_request_t *)ngx_alloc_chain_link(r->pool),
     pnVar12 == (ngx_http_request_t *)0x0)) {
    return -1;
  }
  *(ngx_buf_t **)pnVar12 = pnVar11;
  puVar13 = pnVar11->last;
  memcpy(puVar13,(void *)CONCAT44(method.len._4_4_,(undefined4)method.len),
         CONCAT44(auStack_78._4_4_,auStack_78._0_4_));
  puVar13 = puVar13 + CONCAT44(auStack_78._4_4_,auStack_78._0_4_);
  pnVar11->last = puVar13 + 1;
  *puVar13 = ' ';
  puVar13 = pnVar11->last;
  (pnVar1->uri).data = puVar13;
  if ((*(long *)((long)pvVar2 + 0x238) == 0) ||
     (sVar20 = *(size_t *)((long)pvVar3 + 0x80), sVar20 == 0)) {
    if (!bVar5) {
      pnVar24 = &r->unparsed_uri;
      sVar20 = (r->unparsed_uri).len;
      puVar25 = (r->unparsed_uri).data;
      goto LAB_0016a1fc;
    }
    if ((r->field_0x465 & 8) != 0) {
      memcpy(puVar13,*(void **)((long)pvVar3 + 0x88),*(size_t *)((long)pvVar3 + 0x80));
      puVar13 = puVar13 + *(long *)((long)pvVar3 + 0x80);
      pnVar11->last = puVar13;
    }
    puVar25 = (r->uri).data + lVar14;
    sVar20 = (r->uri).len - lVar14;
    if (lVar7 == 0) {
      memcpy(puVar13,puVar25,sVar20);
      puVar13 = puVar13 + ((r->uri).len - lVar14);
    }
    else {
      ngx_escape_uri(puVar13,puVar25,sVar20,0);
      puVar13 = pnVar11->last + lVar7 + ((r->uri).len - lVar14);
    }
    if ((r->args).len != 0) {
      pnVar24 = &r->args;
      pnVar11->last = puVar13 + 1;
      *puVar13 = '?';
      puVar13 = pnVar11->last;
      sVar20 = (r->args).len;
      puVar25 = (r->args).data;
      goto LAB_0016a1fc;
    }
  }
  else {
    pnVar24 = (ngx_str_t *)((long)pvVar3 + 0x80);
    puVar25 = *(u_char **)((long)pvVar3 + 0x88);
LAB_0016a1fc:
    memcpy(puVar13,puVar25,sVar20);
    puVar13 = puVar13 + pnVar24->len;
  }
  (pnVar1->uri).len = (long)puVar13 - (long)(pnVar1->uri).data;
  if (*(long *)((long)pvVar2 + 0x308) == 0x3e9) {
    builtin_memcpy(puVar13," HTTP/1.1\r\n",0xb);
  }
  else {
    builtin_memcpy(puVar13," HTTP/1.0\r\n",0xb);
  }
  pnVar11->last = puVar13 + 0xb;
  uStack_108 = 0;
  local_120 = 0;
  uStack_118 = 0;
  local_130 = 0;
  uStack_128 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_150 = *(undefined8 **)puVar19[2];
  local_148 = pnVar11->last;
  local_110 = 1;
  plStack_f8 = *(long **)puVar19[1];
  local_100 = r;
  while ((code *)*plStack_f8 != (code *)0x0) {
    (*(code *)*plStack_f8)(&plStack_f8);
    pcVar18 = (code *)*plStack_f8;
    if (pcVar18 == (code *)0x0) {
      bVar17 = (byte)local_110 & 0xfd;
    }
    else {
      lVar22 = 0;
      pcVar21 = (code *)&DAT_00000001;
      while (pcVar21 != (code *)0x0) {
        lVar14 = (*pcVar18)(&plStack_f8);
        lVar22 = lVar22 + lVar14;
        pcVar18 = (code *)*plStack_f8;
        pcVar21 = pcVar18;
      }
      bVar17 = (byte)local_110 & 0xfd | (lVar22 == 2) * '\x02';
    }
    local_110 = CONCAT71(local_110._1_7_,bVar17);
    plStack_f8 = plStack_f8 + 1;
    while ((code *)*local_150 != (code *)0x0) {
      (*(code *)*local_150)(&local_150);
    }
    local_150 = local_150 + 1;
  }
  pnVar11->last = local_148;
  puVar13 = local_148;
  if (*(long *)((long)pvVar2 + 0xb0) != 0) {
    pnVar29 = &(r->headers_in).headers.part;
    pvVar15 = (r->headers_in).headers.part.elts;
    uVar23 = 0;
    do {
      if (pnVar29->nelts <= uVar23) {
        pnVar29 = pnVar29->next;
        if (pnVar29 == (ngx_list_part_t *)0x0) goto LAB_0016a48c;
        pvVar15 = pnVar29->elts;
        uVar23 = 0;
      }
      lVar22 = uVar23 * 0x30;
      pvVar10 = ngx_hash_find((ngx_hash_t *)(puVar19 + 3),*(ngx_uint_t *)((long)pvVar15 + lVar22),
                              *(u_char **)((long)pvVar15 + lVar22 + 0x28),
                              *(size_t *)((long)pvVar15 + lVar22 + 8));
      if (pvVar10 == (void *)0x0) {
        puVar13 = pnVar11->last;
        memcpy(puVar13,*(void **)((long)pvVar15 + lVar22 + 0x10),
               *(size_t *)((long)pvVar15 + lVar22 + 8));
        puVar13 = puVar13 + *(long *)((long)pvVar15 + lVar22 + 8);
        pnVar11->last = puVar13 + 1;
        *puVar13 = ':';
        puVar13 = pnVar11->last;
        pnVar11->last = puVar13 + 1;
        *puVar13 = ' ';
        puVar13 = pnVar11->last;
        memcpy(puVar13,*(void **)((long)pvVar15 + lVar22 + 0x20),
               *(size_t *)((long)pvVar15 + lVar22 + 0x18));
        puVar13 = puVar13 + *(long *)((long)pvVar15 + lVar22 + 0x18);
        pnVar11->last = puVar13 + 1;
        *puVar13 = '\r';
        puVar13 = pnVar11->last;
        pnVar11->last = puVar13 + 1;
        *puVar13 = '\n';
        pnVar4 = r->connection->log;
        if ((pnVar4->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar4,0,"http proxy header: \"%V: %V\"",(long)pvVar15 + lVar22 + 8,
                             (long)pvVar15 + lVar22 + 0x18);
        }
      }
      uVar23 = uVar23 + 1;
    } while( true );
  }
LAB_0016a497:
  pnVar11->last = puVar13 + 1;
  *puVar13 = '\r';
  puVar13 = pnVar11->last;
  pnVar11->last = puVar13 + 1;
  *puVar13 = '\n';
  if (*(undefined8 **)((long)pvVar2 + 0x1c8) != (undefined8 *)0x0) {
    local_150 = (undefined8 *)**(undefined8 **)((long)pvVar2 + 0x1c8);
    local_148 = pnVar11->last;
    local_110 = local_110 & 0xfffffffffffffffd;
    while ((code *)*local_150 != (code *)0x0) {
      (*(code *)*local_150)(&local_150);
    }
    pnVar11->last = local_148;
  }
  pnVar4 = r->connection->log;
  if ((pnVar4->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar4,0,"http proxy header:%N\"%*s\"",
                       (long)pnVar11->last - (long)pnVar11->pos);
  }
  if ((r->field_0x467 & 4) == 0) {
    lVar22 = 0x88;
    pnVar16 = pnVar12;
    if ((*(long *)((long)pvVar2 + 0x1c8) == 0) && (*(long *)((long)pvVar2 + 0xb8) != 0)) {
      pnVar30 = pnVar1->request_bufs;
      pnVar1->request_bufs = (ngx_chain_t *)pnVar12;
      for (; pnVar30 != (ngx_chain_t *)0x0; pnVar30 = pnVar30->next) {
        pnVar11 = (ngx_buf_t *)ngx_palloc(r->pool,0x50);
        if (pnVar11 == (ngx_buf_t *)0x0) {
          return -1;
        }
        pnVar26 = pnVar30->buf;
        pnVar27 = pnVar11;
        for (lVar22 = 10; lVar22 != 0; lVar22 = lVar22 + -1) {
          pnVar27->pos = pnVar26->pos;
          pnVar26 = (ngx_buf_t *)((long)pnVar26 + ((ulong)bVar31 * -2 + 1) * 8);
          pnVar27 = (ngx_buf_t *)((long)pnVar27 + (ulong)bVar31 * -0x10 + 8);
        }
        pnVar16 = (ngx_http_request_t *)ngx_alloc_chain_link(r->pool);
        pnVar12->connection = (ngx_connection_t *)pnVar16;
        if (pnVar16 == (ngx_http_request_t *)0x0) {
          return -1;
        }
        *(ngx_buf_t **)pnVar16 = pnVar11;
        pnVar12 = pnVar16;
      }
      goto LAB_0016a5fc;
    }
  }
  else {
    pnVar1->request_bufs = (ngx_chain_t *)pnVar12;
    if ((*(byte *)((long)pvVar3 + 0xa8) & 2) == 0) goto LAB_0016a5fc;
    (pnVar1->output).output_filter = ngx_http_proxy_body_output_filter;
    lVar22 = 0xf0;
    pnVar16 = r;
  }
  *(ngx_http_request_t **)((long)&pnVar1->read_event_handler + lVar22) = pnVar16;
LAB_0016a5fc:
  pnVar11->field_0x48 = pnVar11->field_0x48 | 0x20;
  pnVar12->connection = (ngx_connection_t *)0x0;
  return 0;
LAB_0016a48c:
  puVar13 = pnVar11->last;
  goto LAB_0016a497;
}

Assistant:

static ngx_int_t
ngx_http_proxy_create_request(ngx_http_request_t *r)
{
    size_t                        len, uri_len, loc_len, body_len;
    uintptr_t                     escape;
    ngx_buf_t                    *b;
    ngx_str_t                     method;
    ngx_uint_t                    i, unparsed_uri;
    ngx_chain_t                  *cl, *body;
    ngx_list_part_t              *part;
    ngx_table_elt_t              *header;
    ngx_http_upstream_t          *u;
    ngx_http_proxy_ctx_t         *ctx;
    ngx_http_script_code_pt       code;
    ngx_http_proxy_headers_t     *headers;
    ngx_http_script_engine_t      e, le;
    ngx_http_proxy_loc_conf_t    *plcf;
    ngx_http_script_len_code_pt   lcode;

    u = r->upstream;

    plcf = ngx_http_get_module_loc_conf(r, ngx_http_proxy_module);

#if (NGX_HTTP_CACHE)
    headers = u->cacheable ? &plcf->headers_cache : &plcf->headers;
#else
    headers = &plcf->headers;
#endif

    if (u->method.len) {
        /* HEAD was changed to GET to cache response */
        method = u->method;

    } else if (plcf->method) {
        if (ngx_http_complex_value(r, plcf->method, &method) != NGX_OK) {
            return NGX_ERROR;
        }

    } else {
        method = r->method_name;
    }

    ctx = ngx_http_get_module_ctx(r, ngx_http_proxy_module);

    if (method.len == 4
        && ngx_strncasecmp(method.data, (u_char *) "HEAD", 4) == 0)
    {
        ctx->head = 1;
    }

    len = method.len + 1 + sizeof(ngx_http_proxy_version) - 1
          + sizeof(CRLF) - 1;

    escape = 0;
    loc_len = 0;
    unparsed_uri = 0;

    if (plcf->proxy_lengths && ctx->vars.uri.len) {
        uri_len = ctx->vars.uri.len;

    } else if (ctx->vars.uri.len == 0 && r->valid_unparsed_uri && r == r->main)
    {
        unparsed_uri = 1;
        uri_len = r->unparsed_uri.len;

    } else {
        loc_len = (r->valid_location && ctx->vars.uri.len) ?
                      plcf->location.len : 0;

        if (r->quoted_uri || r->space_in_uri || r->internal) {
            escape = 2 * ngx_escape_uri(NULL, r->uri.data + loc_len,
                                        r->uri.len - loc_len, NGX_ESCAPE_URI);
        }

        uri_len = ctx->vars.uri.len + r->uri.len - loc_len + escape
                  + sizeof("?") - 1 + r->args.len;
    }

    if (uri_len == 0) {
        ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                      "zero length URI to proxy");
        return NGX_ERROR;
    }

    len += uri_len;

    ngx_memzero(&le, sizeof(ngx_http_script_engine_t));

    ngx_http_script_flush_no_cacheable_variables(r, plcf->body_flushes);
    ngx_http_script_flush_no_cacheable_variables(r, headers->flushes);

    if (plcf->body_lengths) {
        le.ip = plcf->body_lengths->elts;
        le.request = r;
        le.flushed = 1;
        body_len = 0;

        while (*(uintptr_t *) le.ip) {
            lcode = *(ngx_http_script_len_code_pt *) le.ip;
            body_len += lcode(&le);
        }

        ctx->internal_body_length = body_len;
        len += body_len;

    } else if (r->headers_in.chunked && r->reading_body) {
        ctx->internal_body_length = -1;
        ctx->internal_chunked = 1;

    } else {
        ctx->internal_body_length = r->headers_in.content_length_n;
    }

    le.ip = headers->lengths->elts;
    le.request = r;
    le.flushed = 1;

    while (*(uintptr_t *) le.ip) {
        while (*(uintptr_t *) le.ip) {
            lcode = *(ngx_http_script_len_code_pt *) le.ip;
            len += lcode(&le);
        }
        le.ip += sizeof(uintptr_t);
    }


    if (plcf->upstream.pass_request_headers) {
        part = &r->headers_in.headers.part;
        header = part->elts;

        for (i = 0; /* void */; i++) {

            if (i >= part->nelts) {
                if (part->next == NULL) {
                    break;
                }

                part = part->next;
                header = part->elts;
                i = 0;
            }

            if (ngx_hash_find(&headers->hash, header[i].hash,
                              header[i].lowcase_key, header[i].key.len))
            {
                continue;
            }

            len += header[i].key.len + sizeof(": ") - 1
                + header[i].value.len + sizeof(CRLF) - 1;
        }
    }


    b = ngx_create_temp_buf(r->pool, len);
    if (b == NULL) {
        return NGX_ERROR;
    }

    cl = ngx_alloc_chain_link(r->pool);
    if (cl == NULL) {
        return NGX_ERROR;
    }

    cl->buf = b;


    /* the request line */

    b->last = ngx_copy(b->last, method.data, method.len);
    *b->last++ = ' ';

    u->uri.data = b->last;

    if (plcf->proxy_lengths && ctx->vars.uri.len) {
        b->last = ngx_copy(b->last, ctx->vars.uri.data, ctx->vars.uri.len);

    } else if (unparsed_uri) {
        b->last = ngx_copy(b->last, r->unparsed_uri.data, r->unparsed_uri.len);

    } else {
        if (r->valid_location) {
            b->last = ngx_copy(b->last, ctx->vars.uri.data, ctx->vars.uri.len);
        }

        if (escape) {
            ngx_escape_uri(b->last, r->uri.data + loc_len,
                           r->uri.len - loc_len, NGX_ESCAPE_URI);
            b->last += r->uri.len - loc_len + escape;

        } else {
            b->last = ngx_copy(b->last, r->uri.data + loc_len,
                               r->uri.len - loc_len);
        }

        if (r->args.len > 0) {
            *b->last++ = '?';
            b->last = ngx_copy(b->last, r->args.data, r->args.len);
        }
    }

    u->uri.len = b->last - u->uri.data;

    if (plcf->http_version == NGX_HTTP_VERSION_11) {
        b->last = ngx_cpymem(b->last, ngx_http_proxy_version_11,
                             sizeof(ngx_http_proxy_version_11) - 1);

    } else {
        b->last = ngx_cpymem(b->last, ngx_http_proxy_version,
                             sizeof(ngx_http_proxy_version) - 1);
    }

    ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

    e.ip = headers->values->elts;
    e.pos = b->last;
    e.request = r;
    e.flushed = 1;

    le.ip = headers->lengths->elts;

    while (*(uintptr_t *) le.ip) {
        lcode = *(ngx_http_script_len_code_pt *) le.ip;

        /* skip the header line name length */
        (void) lcode(&le);

        if (*(ngx_http_script_len_code_pt *) le.ip) {

            for (len = 0; *(uintptr_t *) le.ip; len += lcode(&le)) {
                lcode = *(ngx_http_script_len_code_pt *) le.ip;
            }

            e.skip = (len == sizeof(CRLF) - 1) ? 1 : 0;

        } else {
            e.skip = 0;
        }

        le.ip += sizeof(uintptr_t);

        while (*(uintptr_t *) e.ip) {
            code = *(ngx_http_script_code_pt *) e.ip;
            code((ngx_http_script_engine_t *) &e);
        }
        e.ip += sizeof(uintptr_t);
    }

    b->last = e.pos;


    if (plcf->upstream.pass_request_headers) {
        part = &r->headers_in.headers.part;
        header = part->elts;

        for (i = 0; /* void */; i++) {

            if (i >= part->nelts) {
                if (part->next == NULL) {
                    break;
                }

                part = part->next;
                header = part->elts;
                i = 0;
            }

            if (ngx_hash_find(&headers->hash, header[i].hash,
                              header[i].lowcase_key, header[i].key.len))
            {
                continue;
            }

            b->last = ngx_copy(b->last, header[i].key.data, header[i].key.len);

            *b->last++ = ':'; *b->last++ = ' ';

            b->last = ngx_copy(b->last, header[i].value.data,
                               header[i].value.len);

            *b->last++ = CR; *b->last++ = LF;

            ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http proxy header: \"%V: %V\"",
                           &header[i].key, &header[i].value);
        }
    }


    /* add "\r\n" at the header end */
    *b->last++ = CR; *b->last++ = LF;

    if (plcf->body_values) {
        e.ip = plcf->body_values->elts;
        e.pos = b->last;
        e.skip = 0;

        while (*(uintptr_t *) e.ip) {
            code = *(ngx_http_script_code_pt *) e.ip;
            code((ngx_http_script_engine_t *) &e);
        }

        b->last = e.pos;
    }

    ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http proxy header:%N\"%*s\"",
                   (size_t) (b->last - b->pos), b->pos);

    if (r->request_body_no_buffering) {

        u->request_bufs = cl;

        if (ctx->internal_chunked) {
            u->output.output_filter = ngx_http_proxy_body_output_filter;
            u->output.filter_ctx = r;
        }

    } else if (plcf->body_values == NULL && plcf->upstream.pass_request_body) {

        body = u->request_bufs;
        u->request_bufs = cl;

        while (body) {
            b = ngx_alloc_buf(r->pool);
            if (b == NULL) {
                return NGX_ERROR;
            }

            ngx_memcpy(b, body->buf, sizeof(ngx_buf_t));

            cl->next = ngx_alloc_chain_link(r->pool);
            if (cl->next == NULL) {
                return NGX_ERROR;
            }

            cl = cl->next;
            cl->buf = b;

            body = body->next;
        }

    } else {
        u->request_bufs = cl;
    }

    b->flush = 1;
    cl->next = NULL;

    return NGX_OK;
}